

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_traits.hpp
# Opt level: O2

void jsoncons::
     encode_traits<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,wchar_t,void>
     ::encode<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *val,basic_json_visitor<wchar_t> *encoder,
               basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *proto,
               error_code *ec)

{
  pointer val_00;
  undefined **local_38;
  
  local_38 = &PTR__ser_context_00997908;
  (*encoder->_vptr_basic_json_visitor[7])
            (encoder,(long)(val->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(val->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 5,0,&local_38,ec);
  if (ec->_M_value == 0) {
    val_00 = (val->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    do {
      if (val_00 == (val->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        local_38 = &PTR__ser_context_00997908;
        (*encoder->_vptr_basic_json_visitor[8])(encoder,&local_38,ec);
        return;
      }
      encode_traits<std::__cxx11::string,wchar_t,void>::
      encode<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>>
                (val_00,encoder,proto,ec);
      val_00 = val_00 + 1;
    } while (ec->_M_value == 0);
  }
  return;
}

Assistant:

static void encode(const T& val, 
                           basic_json_visitor<CharT>& encoder, 
                           const Json& proto, 
                           std::error_code& ec)
        {
            encoder.begin_array(val.size(),semantic_tag::none,ser_context(),ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            for (auto it = std::begin(val); it != std::end(val); ++it)
            {
                encode_traits<value_type,CharT>::encode(*it, encoder, proto, ec);
                if (JSONCONS_UNLIKELY(ec)) {return;}
            }
            encoder.end_array(ser_context(), ec);
        }